

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontGlyphRangesBuilder::AddText(ImFontGlyphRangesBuilder *this,char *text,char *text_end)

{
  int iVar1;
  uint local_34;
  uint local_24;
  int c_len;
  uint c;
  char *text_end_local;
  char *text_local;
  ImFontGlyphRangesBuilder *this_local;
  
  _c_len = text_end;
  text_end_local = text;
  text_local = (char *)this;
  while( true ) {
    if (_c_len == (char *)0x0) {
      local_34 = (uint)*text_end_local;
    }
    else {
      local_34 = (uint)(text_end_local < _c_len);
    }
    if (local_34 == 0) break;
    local_24 = 0;
    iVar1 = ImTextCharFromUtf8(&local_24,text_end_local,_c_len);
    text_end_local = text_end_local + iVar1;
    if (iVar1 == 0) {
      return;
    }
    AddChar(this,(ImWchar)local_24);
  }
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddText(const char* text, const char* text_end)
{
    while (text_end ? (text < text_end) : *text)
    {
        unsigned int c = 0;
        int c_len = ImTextCharFromUtf8(&c, text, text_end);
        text += c_len;
        if (c_len == 0)
            break;
        AddChar((ImWchar)c);
    }
}